

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitForIn(ParseNodeForInOrForOf *loopNode,ByteCodeLabel loopEntrance,
              ByteCodeLabel continuePastLoop,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo
              ,BOOL fReturnValue)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint C1;
  uint loopId_00;
  undefined4 *puVar4;
  ByteCodeWriter *pBVar5;
  uint loopId;
  uint forInLoopLevel;
  BOOL fReturnValue_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ByteCodeLabel continuePastLoop_local;
  ByteCodeLabel loopEntrance_local;
  ParseNodeForInOrForOf *loopNode_local;
  
  if ((loopNode->super_ParseNodeStmt).super_ParseNode.nop != knopForIn) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x264a,"(loopNode->nop == knopForIn)","loopNode->nop == knopForIn");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((loopNode->super_ParseNodeStmt).super_ParseNode.location != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x264b,"(loopNode->location == Js::Constants::NoRegister)",
                       "loopNode->location == Js::Constants::NoRegister");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  RVar3 = FuncInfo::AcquireTmpRegister(funcInfo);
  loopNode->itemLocation = RVar3;
  C1 = FuncInfo::AcquireForInLoopLevel(funcInfo);
  pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg1Unsigned1(pBVar5,InitForInEnumerator,loopNode->pnodeObj->location,C1);
  ByteCodeGenerator::EndStatement(byteCodeGenerator,(ParseNode *)loopNode);
  pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
  loopId_00 = Js::ByteCodeWriter::EnterLoop(pBVar5,loopEntrance);
  ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,(ParseNode *)loopNode,loopId_00);
  ByteCodeGenerator::StartStatement(byteCodeGenerator,loopNode->pnodeLval);
  pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::BrReg1Unsigned1(pBVar5,BrOnEmpty,continuePastLoop,loopNode->itemLocation,C1);
  EmitForInOfLoopBody(loopNode,loopEntrance,continuePastLoop,byteCodeGenerator,funcInfo,fReturnValue
                     );
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::ExitLoop(pBVar5,loopId_00);
  FuncInfo::ReleaseForInLoopLevel(funcInfo,C1);
  return;
}

Assistant:

void EmitForIn(ParseNodeForInOrForOf *loopNode,
    Js::ByteCodeLabel loopEntrance,
    Js::ByteCodeLabel continuePastLoop,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    BOOL fReturnValue)
{
    Assert(loopNode->nop == knopForIn);
    Assert(loopNode->location == Js::Constants::NoRegister);

    // Grab registers for the enumerator and for the current enumerated item.
    // The enumerator register will be released after this call returns.
    loopNode->itemLocation = funcInfo->AcquireTmpRegister();

    uint forInLoopLevel = funcInfo->AcquireForInLoopLevel();

    // get enumerator from the collection
    byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::InitForInEnumerator, loopNode->pnodeObj->location, forInLoopLevel);

    // The StartStatement is already done in the caller of the current function, which is EmitForInOrForOf
    byteCodeGenerator->EndStatement(loopNode);

    // Need to increment loop count whether we are going into profile or not for HasLoop()
    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    // The EndStatement will happen in the EmitForInOfLoopBody function
    byteCodeGenerator->StartStatement(loopNode->pnodeLval);

    // branch past loop when MoveAndGetNext returns nullptr
    byteCodeGenerator->Writer()->BrReg1Unsigned1(Js::OpCode::BrOnEmpty, continuePastLoop, loopNode->itemLocation, forInLoopLevel);

    EmitForInOfLoopBody(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);

    funcInfo->ReleaseForInLoopLevel(forInLoopLevel);
}